

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  FieldDescriptor *in_RDX;
  string local_30;
  
  GetFieldName_abi_cxx11_(&local_30,(csharp *)this->descriptor_,in_RDX);
  UnderscoresToCamelCase(__return_storage_ptr__,&local_30,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::name() {
  return UnderscoresToCamelCase(GetFieldName(descriptor_), false);
}